

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void pnga_access_block_grid_idx(Integer g_a,Integer *subscript,AccessIndex *index,Integer *ld)

{
  short sVar1;
  long lVar2;
  Integer IVar3;
  ulong uVar4;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long lptr;
  unsigned_long lref;
  unsigned_long elemsize;
  Integer ndim;
  Integer i;
  Integer handle;
  char *ptr;
  Integer in_stack_00000128;
  char *in_stack_00000130;
  Integer *in_stack_000003e8;
  void *in_stack_000003f0;
  Integer *in_stack_000003f8;
  Integer in_stack_00000400;
  DoubleComplex *local_50;
  long local_38;
  ulong local_28;
  
  lVar2 = in_RDI + 1000;
  local_50 = (DoubleComplex *)0x0;
  sVar1 = GA[lVar2].ndim;
  for (local_38 = 0; local_38 < sVar1; local_38 = local_38 + 1) {
    if ((*(long *)(in_RSI + local_38 * 8) < 0) ||
       (GA[lVar2].num_blocks[local_38] <= *(long *)(in_RSI + local_38 * 8))) {
      pnga_error(in_stack_00000130,in_stack_00000128);
    }
  }
  pnga_access_block_grid_ptr
            (in_stack_00000400,in_stack_000003f8,in_stack_000003f0,in_stack_000003e8);
  uVar4 = (ulong)GA[lVar2].elemsize;
  IVar3 = pnga_type_c2f((long)GA[lVar2].type);
  switch(IVar3) {
  case 0x3f2:
    *in_RDX = (long)(local_28 - (long)INT_MB) >> 3;
    local_50 = (DoubleComplex *)INT_MB;
    break;
  case 0x3f4:
    *in_RDX = (long)(local_28 - (long)FLT_MB) >> 2;
    local_50 = (DoubleComplex *)FLT_MB;
    break;
  case 0x3f5:
    *in_RDX = (long)(local_28 - (long)DBL_MB) >> 3;
    local_50 = (DoubleComplex *)DBL_MB;
    break;
  case 0x3f6:
    *in_RDX = (long)(local_28 - (long)SCPL_MB) >> 3;
    local_50 = (DoubleComplex *)SCPL_MB;
    break;
  case 0x3f7:
    *in_RDX = (long)(local_28 - (long)DCPL_MB) >> 4;
    local_50 = DCPL_MB;
  }
  if (local_28 % uVar4 != (ulong)local_50 % uVar4) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",GAme & 0xffffffff,local_28,local_28 % uVar4,local_50,
           (ulong)local_50 % uVar4);
    pnga_error(in_stack_00000130,in_stack_00000128);
  }
  *in_RDX = *in_RDX + 1;
  return;
}

Assistant:

void pnga_access_block_grid_idx(Integer g_a, Integer* subscript,
                                AccessIndex *index, Integer *ld)
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i,ndim/*,p_handle*/;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   /*p_handle = GA[handle].p_handle;*/
   ndim = GA[handle].ndim;
   for (i=0; i<ndim; i++) 
     if (subscript[i]<0 || subscript[i] >= GA[handle].num_blocks[i]) 
       pnga_error("index outside allowed values",subscript[i]);

   pnga_access_block_grid_ptr(g_a,subscript,&ptr,ld);
   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}